

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int BrotliDecoderIsFinished(BrotliDecoderStateInternal *s)

{
  uint uVar1;
  
  uVar1 = 0;
  if (((s->state == BROTLI_STATE_DONE) && (uVar1 = 1, -1 < s->error_code)) &&
     (s->ringbuffer != (uint8_t *)0x0)) {
    uVar1 = (uint)((long)s->ringbuffer_size * s->rb_roundtrips + ((long)s->pos - s->partial_pos_out)
                  == 0);
  }
  return uVar1;
}

Assistant:

BROTLI_BOOL BrotliDecoderIsFinished(const BrotliDecoderState* s) {
  return TO_BROTLI_BOOL(s->state == BROTLI_STATE_DONE) &&
      !BrotliDecoderHasMoreOutput(s);
}